

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<double> * __thiscall
tinyusdz::XformOp::get_value<double>
          (optional<double> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<double> local_48;
  double local_30;
  double value;
  double dStack_20;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  value._4_4_ = interp;
  dStack_20 = t;
  t_local = (double)this;
  this_local = (XformOp *)__return_storage_ptr__;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    bVar1 = get_interpolated_value<double>(this,&local_30,dStack_20,value._4_4_);
    if (bVar1) {
      nonstd::optional_lite::optional<double>::optional<double,_0>(__return_storage_ptr__,&local_30)
      ;
    }
    else {
      nonstd::optional_lite::optional<double>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<double>(&local_48,&this->_var);
    nonstd::optional_lite::optional<double>::optional<double,_0>(__return_storage_ptr__,&local_48);
    nonstd::optional_lite::optional<double>::~optional(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }